

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode parse_proxy(SessionHandle *data,connectdata *conn,char *proxy)

{
  int iVar1;
  CURLcode CVar2;
  char *pcVar3;
  ushort **ppuVar4;
  char *pcVar5;
  long lVar6;
  size_t sVar7;
  byte bVar8;
  curl_proxytype cVar9;
  char *proxyuser;
  char *local_40;
  char *local_38;
  
  pcVar3 = strstr(proxy,"://");
  if (pcVar3 != (char *)0x0) {
    iVar1 = Curl_raw_nequal("socks5h",proxy,7);
    cVar9 = CURLPROXY_SOCKS5_HOSTNAME;
    if (iVar1 == 0) {
      iVar1 = Curl_raw_nequal("socks5",proxy,6);
      cVar9 = CURLPROXY_SOCKS5;
      if (iVar1 == 0) {
        iVar1 = Curl_raw_nequal("socks4a",proxy,7);
        cVar9 = CURLPROXY_SOCKS4A;
        if (iVar1 == 0) {
          iVar1 = Curl_raw_nequal("socks4",proxy,6);
          cVar9 = CURLPROXY_SOCKS4;
          if ((iVar1 == 0) &&
             (iVar1 = Curl_raw_nequal("socks",proxy,5), proxy = pcVar3 + 3, iVar1 == 0))
          goto LAB_004807b3;
        }
      }
    }
    conn->proxytype = cVar9;
    proxy = pcVar3 + 3;
  }
LAB_004807b3:
  pcVar3 = strchr(proxy,0x40);
  if (pcVar3 != (char *)0x0) {
    local_40 = (char *)0x0;
    local_38 = (char *)0x0;
    CVar2 = parse_login_details(proxy,(long)pcVar3 - (long)proxy,&local_40,&local_38,(char **)0x0);
    if (CVar2 == CURLE_OK) {
      if (conn->proxyuser != (char *)0x0) {
        (*Curl_cfree)(conn->proxyuser);
        conn->proxyuser = (char *)0x0;
      }
      pcVar5 = local_40;
      if ((local_40 == (char *)0x0) || (sVar7 = strlen(local_40), 0xff < sVar7)) {
        pcVar5 = (*Curl_cstrdup)("");
      }
      else {
        pcVar5 = curl_easy_unescape(data,pcVar5,0,(int *)0x0);
      }
      conn->proxyuser = pcVar5;
      CVar2 = CURLE_OUT_OF_MEMORY;
      if (pcVar5 != (char *)0x0) {
        if (conn->proxypasswd != (char *)0x0) {
          (*Curl_cfree)(conn->proxypasswd);
          conn->proxypasswd = (char *)0x0;
        }
        pcVar5 = local_38;
        if ((local_38 == (char *)0x0) || (sVar7 = strlen(local_38), 0xff < sVar7)) {
          pcVar5 = (*Curl_cstrdup)("");
        }
        else {
          pcVar5 = curl_easy_unescape(data,pcVar5,0,(int *)0x0);
        }
        conn->proxypasswd = pcVar5;
        if (pcVar5 != (char *)0x0) {
          (conn->bits).proxy_user_passwd = true;
          proxy = pcVar3 + 1;
          CVar2 = CURLE_OK;
        }
      }
    }
    if (local_40 != (char *)0x0) {
      (*Curl_cfree)(local_40);
      local_40 = (char *)0x0;
    }
    if (local_38 != (char *)0x0) {
      (*Curl_cfree)(local_38);
    }
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
  }
  pcVar3 = proxy;
  if (*proxy != '[') goto LAB_0048088f;
  bVar8 = proxy[1];
  pcVar3 = proxy + 1;
  proxy = pcVar3;
  if (bVar8 != 0) {
    ppuVar4 = __ctype_b_loc();
    do {
      if (((((*ppuVar4)[bVar8] >> 0xc & 1) == 0) && (bVar8 != 0x2e)) && (bVar8 != 0x3a)) {
        if (bVar8 != 0x25) goto LAB_00480a9c;
        if ((byte)proxy[1] - 0x32 == 0) {
          iVar1 = 0x35 - (uint)(byte)proxy[2];
        }
        else {
          iVar1 = -((byte)proxy[1] - 0x32);
        }
        if (iVar1 != 0) {
          Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
        }
        bVar8 = proxy[1];
        proxy = proxy + 1;
        if (bVar8 != 0) {
          goto LAB_00480a68;
        }
        break;
      }
      bVar8 = proxy[1];
      proxy = proxy + 1;
    } while (bVar8 != 0);
  }
  goto LAB_00480879;
LAB_00480a9c:
  if (bVar8 != 0x5d) goto LAB_00480879;
  *proxy = '\0';
  proxy = proxy + 1;
  goto LAB_0048088f;
  while( true ) {
    bVar8 = proxy[1];
    proxy = proxy + 1;
    if (bVar8 == 0) break;
LAB_00480a68:
    if (((((*ppuVar4)[bVar8] & 0x1400) == 0) && (1 < bVar8 - 0x2d)) &&
       ((bVar8 != 0x5f && (bVar8 != 0x7e)))) goto LAB_00480a9c;
  }
LAB_00480879:
  Curl_infof(data,"Invalid IPv6 address format\n");
LAB_0048088f:
  pcVar5 = strchr(proxy,0x3a);
  if (pcVar5 == (char *)0x0) {
    if (*pcVar3 == '/') {
      return CURLE_COULDNT_RESOLVE_PROXY;
    }
    pcVar5 = strchr(pcVar3,0x2f);
    if (pcVar5 != (char *)0x0) {
      *pcVar5 = '\0';
    }
    lVar6 = (data->set).proxyport;
    if (lVar6 == 0) goto LAB_004808c1;
  }
  else {
    *pcVar5 = '\0';
    lVar6 = strtol(pcVar5 + 1,(char **)0x0,10);
  }
  conn->port = lVar6;
LAB_004808c1:
  pcVar3 = (*Curl_cstrdup)(pcVar3);
  (conn->proxy).rawalloc = pcVar3;
  (conn->proxy).name = pcVar3;
  CVar2 = CURLE_OUT_OF_MEMORY;
  if (pcVar3 != (char *)0x0) {
    CVar2 = CURLE_OK;
  }
  return CVar2;
}

Assistant:

static CURLcode parse_proxy(struct SessionHandle *data,
                            struct connectdata *conn, char *proxy)
{
  char *prox_portno;
  char *endofprot;

  /* We use 'proxyptr' to point to the proxy name from now on... */
  char *proxyptr;
  char *portptr;
  char *atsign;

  /* We do the proxy host string parsing here. We want the host name and the
   * port name. Accept a protocol:// prefix
   */

  /* Parse the protocol part if present */
  endofprot = strstr(proxy, "://");
  if(endofprot) {
    proxyptr = endofprot+3;
    if(checkprefix("socks5h", proxy))
      conn->proxytype = CURLPROXY_SOCKS5_HOSTNAME;
    else if(checkprefix("socks5", proxy))
      conn->proxytype = CURLPROXY_SOCKS5;
    else if(checkprefix("socks4a", proxy))
      conn->proxytype = CURLPROXY_SOCKS4A;
    else if(checkprefix("socks4", proxy) || checkprefix("socks", proxy))
      conn->proxytype = CURLPROXY_SOCKS4;
    /* Any other xxx:// : change to http proxy */
  }
  else
    proxyptr = proxy; /* No xxx:// head: It's a HTTP proxy */

  /* Is there a username and password given in this proxy url? */
  atsign = strchr(proxyptr, '@');
  if(atsign) {
    CURLcode res = CURLE_OK;
    char *proxyuser = NULL;
    char *proxypasswd = NULL;

    res = parse_login_details(proxyptr, atsign - proxyptr,
                              &proxyuser, &proxypasswd, NULL);
    if(!res) {
      /* found user and password, rip them out.  note that we are
         unescaping them, as there is otherwise no way to have a
         username or password with reserved characters like ':' in
         them. */
      Curl_safefree(conn->proxyuser);
      if(proxyuser && strlen(proxyuser) < MAX_CURL_USER_LENGTH)
        conn->proxyuser = curl_easy_unescape(data, proxyuser, 0, NULL);
      else
        conn->proxyuser = strdup("");

      if(!conn->proxyuser)
        res = CURLE_OUT_OF_MEMORY;
      else {
        Curl_safefree(conn->proxypasswd);
        if(proxypasswd && strlen(proxypasswd) < MAX_CURL_PASSWORD_LENGTH)
          conn->proxypasswd = curl_easy_unescape(data, proxypasswd, 0, NULL);
        else
          conn->proxypasswd = strdup("");

        if(!conn->proxypasswd)
          res = CURLE_OUT_OF_MEMORY;
      }

      if(!res) {
        conn->bits.proxy_user_passwd = TRUE; /* enable it */
        atsign++; /* the right side of the @-letter */

        if(atsign)
          proxyptr = atsign; /* now use this instead */
        else
          res = CURLE_OUT_OF_MEMORY;
      }
    }

    Curl_safefree(proxyuser);
    Curl_safefree(proxypasswd);

    if(res)
      return res;
  }

  /* start scanning for port number at this point */
  portptr = proxyptr;

  /* detect and extract RFC6874-style IPv6-addresses */
  if(*proxyptr == '[') {
    char *ptr = ++proxyptr; /* advance beyond the initial bracket */
    while(*ptr && (ISXDIGIT(*ptr) || (*ptr == ':') || (*ptr == '.')))
      ptr++;
    if(*ptr == '%') {
      /* There might be a zone identifier */
      if(strncmp("%25", ptr, 3))
        infof(data, "Please URL encode %% as %%25, see RFC 6874.\n");
      ptr++;
      /* Allow unresered characters as defined in RFC 3986 */
      while(*ptr && (ISALPHA(*ptr) || ISXDIGIT(*ptr) || (*ptr == '-') ||
                     (*ptr == '.') || (*ptr == '_') || (*ptr == '~')))
        ptr++;
    }
    if(*ptr == ']')
      /* yeps, it ended nicely with a bracket as well */
      *ptr++ = 0;
    else
      infof(data, "Invalid IPv6 address format\n");
    portptr = ptr;
    /* Note that if this didn't end with a bracket, we still advanced the
     * proxyptr first, but I can't see anything wrong with that as no host
     * name nor a numeric can legally start with a bracket.
     */
  }

  /* Get port number off proxy.server.com:1080 */
  prox_portno = strchr(portptr, ':');
  if(prox_portno) {
    *prox_portno = 0x0; /* cut off number from host name */
    prox_portno ++;
    /* now set the local port number */
    conn->port = strtol(prox_portno, NULL, 10);
  }
  else {
    if(proxyptr[0]=='/')
      /* If the first character in the proxy string is a slash, fail
         immediately. The following code will otherwise clear the string which
         will lead to code running as if no proxy was set! */
      return CURLE_COULDNT_RESOLVE_PROXY;

    /* without a port number after the host name, some people seem to use
       a slash so we strip everything from the first slash */
    atsign = strchr(proxyptr, '/');
    if(atsign)
      *atsign = 0x0; /* cut off path part from host name */

    if(data->set.proxyport)
      /* None given in the proxy string, then get the default one if it is
         given */
      conn->port = data->set.proxyport;
  }

  /* now, clone the cleaned proxy host name */
  conn->proxy.rawalloc = strdup(proxyptr);
  conn->proxy.name = conn->proxy.rawalloc;

  if(!conn->proxy.rawalloc)
    return CURLE_OUT_OF_MEMORY;

  return CURLE_OK;
}